

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

uint utf8_next_char(string *input,size_type *i)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  uint uVar4;
  
  sVar2 = *i;
  pcVar3 = (input->_M_dataplus)._M_p;
  bVar1 = pcVar3[sVar2];
  if (bVar1 == 0) {
    return 0;
  }
  if ((bVar1 & 0xe0) == 0xc0) {
    *i = sVar2 + 2;
    uVar4 = ((byte)pcVar3[sVar2] & 0x1f) << 6;
    bVar1 = pcVar3[sVar2 + 1];
  }
  else {
    if ((bVar1 & 0xf0) == 0xe0) {
      *i = sVar2 + 3;
      return (byte)pcVar3[sVar2 + 2] & 0x3f |
             ((byte)pcVar3[sVar2 + 1] & 0x3f) << 6 | ((byte)pcVar3[sVar2] & 0xf) << 0xc;
    }
    if ((bVar1 & 0xf8) != 0xf0) {
      *i = sVar2 + 1;
      return (int)pcVar3[sVar2];
    }
    *i = sVar2 + 4;
    uVar4 = ((byte)pcVar3[sVar2 + 2] & 0x3f) << 6 |
            ((byte)pcVar3[sVar2 + 1] & 0x3f) << 0xc | ((byte)pcVar3[sVar2] & 7) << 0x12;
    bVar1 = pcVar3[sVar2 + 3];
  }
  return bVar1 & 0x3f | uVar4;
}

Assistant:

unsigned int utf8_next_char (const std::string& input, std::string::size_type& i)
{
  if (input[i] == '\0')
    return 0;

  // How many bytes in the sequence?
  int length = utf8_sequence (input[i]);
  i += length;

  // 0xxxxxxx -> 0xxxxxxx
  if (length == 1)
    return input[i - 1];

  // 110yyyyy 10xxxxxx -> 00000yyy yyxxxxxx
  if (length == 2)
    return ((input[i - 2] & 0x1F) << 6) +
            (input[i - 1] & 0x3F);

  // 1110zzzz 10yyyyyy 10xxxxxx -> zzzzyyyy yyxxxxxx
  if (length == 3)
    return ((input[i - 3] & 0xF)  << 12) +
           ((input[i - 2] & 0x3F) <<  6) +
            (input[i - 1] & 0x3F);

  // 11110www 10zzzzzz 10yyyyyy 10xxxxxx -> 000wwwzz zzzzyyyy yyxxxxxx
  if (length == 4)
    return ((input[i - 4] & 0x7)  << 18) +
           ((input[i - 3] & 0x3F) << 12) +
           ((input[i - 2] & 0x3F) <<  6) +
            (input[i - 1] & 0x3F);

  // Default: pretend as though it's a single character.
  // TODO Or should this throw?
  return input[i - 1];
}